

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher_list<void_()>::decommission(call_matcher_list<void_()> *this)

{
  bool bVar1;
  call_matcher_base<void_()> *this_00;
  char *__name;
  call_matcher_base<void_()> *m;
  iterator i;
  iterator e;
  iterator iter;
  unique_lock<std::recursive_mutex> lock;
  call_matcher_list<void_()> *this_local;
  
  get_lock<void>();
  e = list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::begin
                (&this->
                  super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>)
  ;
  i = list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::end
                (&this->
                  super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>)
  ;
  while( true ) {
    bVar1 = trompeloeil::operator!=(&e,&i);
    if (!bVar1) break;
    __name = (char *)0x0;
    m = (call_matcher_base<void_()> *)
        list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::iterator::
        operator++(&e,0);
    this_00 = list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::iterator
              ::operator*((iterator *)&m);
    (*(this_00->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[2])();
    list_elem<trompeloeil::call_matcher_base<void_()>_>::unlink
              (&this_00->super_list_elem<trompeloeil::call_matcher_base<void_()>_>,__name);
  }
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&iter);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto i = iter++;
        auto &m = *i;
        m.mock_destroyed();
        m.unlink();
      }
    }